

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

string * __thiscall
IDLExport::getIDLRelative
          (string *__return_storage_ptr__,IDLExport *this,Type *type,string *relative_to)

{
  string local_48;
  string *local_28;
  string *relative_to_local;
  Type *type_local;
  IDLExport *this_local;
  
  local_28 = relative_to;
  relative_to_local = (string *)type;
  type_local = (Type *)this;
  this_local = (IDLExport *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_48);
  anon_unknown.dwarf_1785d::getIDLRelative(__return_storage_ptr__,type,relative_to,this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string IDLExport::getIDLRelative(Type const& type, std::string const& relative_to) const
{
    return ::getIDLRelative(type, relative_to, *this);
}